

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O0

bool __thiscall slang::ast::Type::isUnpackedArray(Type *this)

{
  SymbolKind SVar1;
  Type *pTVar2;
  Type *in_RDI;
  bool local_1;
  
  pTVar2 = getCanonicalType(in_RDI);
  SVar1 = (pTVar2->super_Symbol).kind;
  if ((SVar1 - FixedSizeUnpackedArrayType < 2) ||
     (SVar1 == AssociativeArrayType || SVar1 == QueueType)) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Type::isUnpackedArray() const {
    switch (getCanonicalType().kind) {
        case SymbolKind::FixedSizeUnpackedArrayType:
        case SymbolKind::DynamicArrayType:
        case SymbolKind::AssociativeArrayType:
        case SymbolKind::QueueType:
            return true;
        default:
            return false;
    }
}